

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar1;
  cmSourceFile *pcVar2;
  char *pcVar3;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *var;
  string local_88;
  char *local_68;
  char *tgtfmt;
  FortranFormat format;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *srcfmt;
  cmSourceFile *source_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  srcfmt = (char *)source;
  source_local = (cmSourceFile *)flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Fortran_FORMAT",&local_49)
  ;
  pcVar3 = cmSourceFile::GetProperty(source,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = pcVar3;
  tgtfmt._0_4_ = cmOutputConverter::GetFortranFormat(pcVar3);
  if ((FortranFormat)tgtfmt == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Fortran_FORMAT",(allocator<char> *)((long)&var + 7));
    pcVar3 = cmGeneratorTarget::GetProperty(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&var + 7));
    local_68 = pcVar3;
    tgtfmt._0_4_ = cmOutputConverter::GetFortranFormat(pcVar3);
  }
  pcVar2 = source_local;
  local_98 = (char *)0x0;
  if ((FortranFormat)tgtfmt == FortranFormatFixed) {
    local_98 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else if ((FortranFormat)tgtfmt == FortranFormatFree) {
    local_98 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  pcVar3 = local_98;
  if (local_98 != (char *)0x0) {
    this_01 = this->Makefile;
    pcVar1 = this->LocalCommonGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar3,&local_b9);
    pcVar3 = cmMakefile::GetDefinition(this_01,&local_b8);
    (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[7])(pcVar1,pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const char* srcfmt = source.GetProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    const char* tgtfmt = this->GeneratorTarget->GetProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetDefinition(var));
  }
}